

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  MatrixOp op_00;
  InputType inputType_;
  DataType dataType;
  Precision precision_00;
  Context *pCVar2;
  bool bVar3;
  int vecSize;
  TestNode *node;
  char *__rhs;
  ShaderMatrixCase *pSVar4;
  char *pcVar5;
  ShaderMatrixTests *pSVar6;
  InputTypeSpec *pIVar7;
  InputType local_628;
  InputType local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  undefined1 local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  undefined1 local_468 [8];
  ShaderInput otherMatIn_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_410 [8];
  ShaderInput voidInput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  ShaderInput otherMatIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string vecMatName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a4 [8];
  ShaderInput vecIn;
  DataType vecType;
  undefined1 local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_144 [8];
  ShaderInput scalarIn;
  ShaderInput matIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string baseName;
  char *precName;
  Precision precision;
  int precNdx;
  char *matTypeName;
  int local_48;
  DataType matType;
  int matTypeNdx;
  InputType inputType;
  int inTypeNdx;
  TestCaseGroup *opGroup;
  MatrixOp op;
  int inTypeListSize;
  InputTypeSpec *inTypeList;
  int opNdx;
  ShaderMatrixTests *this_local;
  
  inTypeList._4_4_ = 0;
  pSVar6 = this;
  while ((int)inTypeList._4_4_ < 0xf) {
    pIVar7 = init::reducedInputTypes;
    if ((init::ops[(int)inTypeList._4_4_].extendedInputTypeCases & 1U) != 0) {
      pIVar7 = init::extendedInputTypes;
    }
    bVar1 = init::ops[(int)inTypeList._4_4_].extendedInputTypeCases;
    op_00 = init::ops[(int)inTypeList._4_4_].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::ops[(int)inTypeList._4_4_].name,init::ops[(int)inTypeList._4_4_].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    for (matTypeNdx = 0; matTypeNdx < (int)((bVar1 & 1) * 2 + 1); matTypeNdx = matTypeNdx + 1) {
      inputType_ = pIVar7[matTypeNdx].type;
      for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
        dataType = init::matrixTypes[local_48];
        __rhs = glu::getDataTypeName(dataType);
        for (precName._4_4_ = 0; precName._4_4_ < 3; precName._4_4_ = precName._4_4_ + 1) {
          precision_00 = init::precisions[precName._4_4_];
          baseName.field_2._8_8_ = glu::getPrecisionName(precision_00);
          pcVar5 = pIVar7[matTypeNdx].name;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&matIn.precision,pcVar5,
                     (allocator<char> *)((long)&matIn.dataType + 3));
          std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &matIn.precision,"_");
          std::operator+(&local_e8,&local_108,(char *)baseName.field_2._8_8_);
          std::operator+(&local_c8,&local_e8,"_");
          std::operator+(&local_a8,&local_c8,__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,&local_a8,"_");
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&matIn.precision);
          std::allocator<char>::~allocator((allocator<char> *)((long)&matIn.dataType + 3));
          MatrixCaseUtils::ShaderInput::ShaderInput
                    ((ShaderInput *)&scalarIn.dataType,inputType_,dataType,precision_00);
          bVar3 = MatrixCaseUtils::isOperationMatrixScalar(op_00);
          if (bVar3) {
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_144,(op_00 != OP_DIV) + INPUTTYPE_UNIFORM,TYPE_FLOAT,
                       precision_00);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            local_169 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_168,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix-scalar case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_144,op_00,true);
            local_169 = 0;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_168);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            vecIn.precision._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vecType,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_88,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix-scalar case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_144,op_00,false);
            vecIn.precision._3_1_ = PRECISION_LOWP >> 0x18;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&vecType);
          }
          bVar3 = MatrixCaseUtils::isOperationMatrixVector(op_00);
          if (bVar3) {
            vecSize = glu::getDataTypeMatrixNumColumns(dataType);
            vecIn.dataType = glu::getDataTypeFloatVec(vecSize);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_1a4,(op_00 != OP_DIV) + INPUTTYPE_UNIFORM,vecIn.dataType
                       ,precision_00);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            local_1e9 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar5 = glu::getDataTypeName(vecIn.dataType);
            std::operator+(&local_1e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,pcVar5);
            std::operator+(&local_1c8,&local_1e8,"_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix-vector case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_1a4,op_00,true);
            local_1e9 = 0;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1e8);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            vecMatName.field_2._M_local_buf[0xf] = '\x01';
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar5 = glu::getDataTypeName(vecIn.dataType);
            std::operator+(&local_230,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,pcVar5);
            std::operator+(&local_210,&local_230,"_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix-vector case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_1a4,op_00,false);
            vecMatName.field_2._M_local_buf[0xf] = '\0';
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_230);
            pcVar5 = pIVar7[matTypeNdx].name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_318,pcVar5,&local_319);
            std::operator+(&local_2f8,&local_318,"_");
            std::operator+(&local_2d8,&local_2f8,(char *)baseName.field_2._8_8_);
            std::operator+(&local_2b8,&local_2d8,"_");
            pcVar5 = glu::getDataTypeName(vecIn.dataType);
            std::operator+(&local_298,&local_2b8,pcVar5);
            std::operator+(&local_278,&local_298,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258,&local_278,__rhs);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_318);
            std::allocator<char>::~allocator(&local_319);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_340,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258,"_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Vector-matrix case",(ShaderInput *)local_1a4,
                       (ShaderInput *)&scalarIn.dataType,op_00,true);
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_340);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            otherMatIn.dataType._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &otherMatIn.precision,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258,"_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Vector-matrix case",(ShaderInput *)local_1a4,
                       (ShaderInput *)&scalarIn.dataType,op_00,false);
            otherMatIn.dataType._3_1_ = TYPE_INVALID >> 0x18;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&otherMatIn.precision);
            std::__cxx11::string::~string((string *)local_258);
          }
          bVar3 = MatrixCaseUtils::isOperationMatrixMatrix(op_00);
          if (bVar3) {
            local_5b8 = inputType_;
            if (inputType_ == INPUTTYPE_DYNAMIC) {
              local_5b8 = INPUTTYPE_UNIFORM;
            }
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_378,local_5b8,dataType,precision_00);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            local_3b9 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_3b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,__rhs);
            std::operator+(&local_398,&local_3b8,"_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix-matrix case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_378,op_00,true);
            local_3b9 = 0;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&local_3b8);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            voidInput.dataType._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &voidInput.precision,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,__rhs);
            std::operator+(&local_3e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &voidInput.precision,"_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix-matrix case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_378,op_00,false);
            voidInput.dataType._3_1_ = TYPE_INVALID >> 0x18;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_3e0);
            std::__cxx11::string::~string((string *)&voidInput.precision);
          }
          bVar3 = MatrixCaseUtils::isOperationUnary(op_00);
          if (bVar3) {
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_410,INPUTTYPE_LAST,TYPE_LAST,PRECISION_LAST);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_430,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_410,op_00,true);
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_430);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            otherMatIn_1.dataType._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &otherMatIn_1.precision,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_410,op_00,false);
            otherMatIn_1.dataType._3_1_ = TYPE_INVALID >> 0x18;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&otherMatIn_1.precision);
          }
          bVar3 = MatrixCaseUtils::isOperationAssignment(op_00);
          if (bVar3) {
            local_628 = inputType_;
            if (inputType_ == INPUTTYPE_DYNAMIC) {
              local_628 = INPUTTYPE_UNIFORM;
            }
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_468,local_628,dataType,precision_00);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            local_489 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_488,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix assignment case",
                       (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_468,op_00,true);
            local_489 = 0;
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_488);
            pSVar4 = (ShaderMatrixCase *)operator_new(0x148);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,"fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar4,pCVar2,pcVar5,"Matrix assignment case",
                       (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_468,op_00,false);
            tcu::TestNode::addChild(node,(TestNode *)pSVar4);
            std::__cxx11::string::~string((string *)&local_4b0);
          }
          std::__cxx11::string::~string((string *)local_88);
        }
      }
    }
    inTypeList._4_4_ = inTypeList._4_4_ + 1;
    pSVar6 = (ShaderMatrixTests *)(ulong)inTypeList._4_4_;
  }
  return (int)pSVar6;
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	vecType	= getDataTypeFloatVec(getDataTypeMatrixNumColumns(matType));
						ShaderInput vecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, vecType, precision);

						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_vertex").c_str(),	"Matrix-vector case", matIn, vecIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(vecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, vecIn, op, false));

						// Vector-matrix.
						string vecMatName = string(inTypeList[inTypeNdx].name) + "_" + precName + "_" + getDataTypeName(vecType) + "_" + matTypeName;
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", vecIn, matIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", vecIn, matIn, op, false));
					}

					if (isOperationMatrixMatrix(op))
					{
						// Matrix-matrix.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationUnary(op))
					{
						// op matrix
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if (isOperationAssignment(op))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						opGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}